

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_psbt_output_add_unknown
              (wally_psbt_output *parent,uchar *key,size_t key_len,uchar *value,size_t value_len)

{
  int iVar1;
  
  if (parent != (wally_psbt_output *)0x0) {
    iVar1 = map_add(&parent->unknowns,key,key_len,value,value_len,false,
                    (_func_int_uchar_ptr_size_t *)0x0,true);
    return iVar1;
  }
  return -2;
}

Assistant:

int wally_psbt_output_set_blinding_pubkey(struct wally_psbt_output *output,
                                          const unsigned char *pub_key,
                                          size_t pub_key_len)
{
    int ret;
    if (!output || BYTES_INVALID(pub_key, pub_key_len))
        return WALLY_EINVAL;
    if (pub_key &&
        (ret = wally_ec_public_key_verify(pub_key, pub_key_len)) != WALLY_OK)
        return ret;
    return replace_bytes(pub_key, pub_key_len,
                         &output->blinding_pubkey, &output->blinding_pubkey_len);
}